

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalEndWriteTransaction(Wal *pWal)

{
  Wal *pWal_local;
  
  if (pWal->writeLock != '\0') {
    walUnlockExclusive(pWal,0,1);
    pWal->writeLock = '\0';
    pWal->iReCksum = 0;
    pWal->truncateOnCommit = '\0';
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalEndWriteTransaction(Wal *pWal){
  if( pWal->writeLock ){
    walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    pWal->writeLock = 0;
    pWal->iReCksum = 0;
    pWal->truncateOnCommit = 0;
  }
  return SQLITE_OK;
}